

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O0

bool __thiscall rengine::SDLBackend::commitRender(SDLBackend *this)

{
  SDLBackend *this_local;
  
  if (this->m_window == (SDL_Window *)0x0) {
    __assert_fail("m_window",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0xd6,"virtual bool rengine::SDLBackend::commitRender()");
  }
  if (this->m_surface != (Surface *)0x0) {
    if (this->m_gl != (SDL_GLContext)0x0) {
      SDL_GL_SwapWindow(this->m_window);
      return true;
    }
    __assert_fail("m_gl",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0xd8,"virtual bool rengine::SDLBackend::commitRender()");
  }
  __assert_fail("m_surface",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                ,0xd7,"virtual bool rengine::SDLBackend::commitRender()");
}

Assistant:

inline bool SDLBackend::commitRender()
{
    assert(m_window);
    assert(m_surface);
    assert(m_gl);
    SDL_GL_SwapWindow(m_window);
    return true;
}